

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_NCName_ID_IDREF_ENTITY(DataType dt)

{
  DataType DVar1;
  char cVar2;
  XMLCh *pXVar3;
  XSValue *pXVar4;
  long lVar5;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  Status myStatus;
  char iv_3 [5];
  char v_3 [5];
  char iv_1 [9];
  char v_1 [8];
  char v_2 [12];
  char iv_2 [13];
  Status local_98;
  DataType local_94;
  StrX local_90;
  char local_80 [8];
  char local_78 [8];
  char local_70 [16];
  char local_60 [8];
  undefined8 local_58;
  undefined4 local_50;
  char local_48 [20];
  int local_34;
  
  builtin_strncpy(local_60,"Four-_.",8);
  local_58 = 0x68636f7265655a5f;
  local_50 = 0x747265;
  builtin_strncpy(local_78,"L007",5);
  builtin_strncpy(local_70,":Four-_.",9);
  builtin_strncpy(local_48 + 8,"ert:",5);
  builtin_strncpy(local_48,"_Zeeroch",8);
  builtin_strncpy(local_80,"0:07",5);
  local_98 = st_Init;
  local_90.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_94 = dt;
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_90.fUnicodeForm,dt,&local_98,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_90);
  if (cVar2 == '\0') {
    pXVar3 = getDataTypeString(local_94);
    StrX::StrX(&local_90,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1784,local_60,local_90.fLocalForm,1);
    StrX::~StrX(&local_90);
    errSeen = 1;
  }
  local_98 = st_Init;
  local_90.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_90.fUnicodeForm,local_94,&local_98,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_90);
  if (cVar2 == '\0') {
    pXVar3 = getDataTypeString(local_94);
    StrX::StrX(&local_90,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1785,&local_58,local_90.fLocalForm,1);
    StrX::~StrX(&local_90);
    errSeen = 1;
  }
  local_98 = st_Init;
  local_90.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_90.fUnicodeForm,local_94,&local_98,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_90);
  if (cVar2 == '\0') {
    pXVar3 = getDataTypeString(local_94);
    StrX::StrX(&local_90,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1786,local_78,local_90.fLocalForm,1);
    StrX::~StrX(&local_90);
    errSeen = 1;
  }
  local_98 = st_Init;
  local_90.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_90.fUnicodeForm,local_94,&local_98,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_90);
  if (cVar2 != '\0') {
    pXVar3 = getDataTypeString(local_94);
    StrX::StrX(&local_90,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1789,local_70,local_90.fLocalForm,0);
    StrX::~StrX(&local_90);
    errSeen = 1;
  }
  local_98 = st_Init;
  local_90.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_90.fUnicodeForm,local_94,&local_98,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_90);
  if (cVar2 != '\0') {
    pXVar3 = getDataTypeString(local_94);
    StrX::StrX(&local_90,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178a,local_48,local_90.fLocalForm,0);
    StrX::~StrX(&local_90);
    errSeen = 1;
  }
  local_98 = st_Init;
  local_90.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_90.fUnicodeForm,local_94,&local_98,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_90);
  if (cVar2 != '\0') {
    pXVar3 = getDataTypeString(local_94);
    StrX::StrX(&local_90,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178b,local_80,local_90.fLocalForm,0);
    StrX::~StrX(&local_90);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_98 = st_Init;
    local_34 = iVar9;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    DVar1 = local_94;
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_90.fUnicodeForm,DVar1,&local_98,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    iVar9 = local_34;
    if (pXVar4 == (XSValue *)0x0) {
      if (local_98 != st_NoActVal) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a5,local_60,local_90.fLocalForm,"st_NoActVal",pcVar7);
        StrX::~StrX(&local_90);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      pvVar6 = (void *)0x17a5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a5,local_60);
      StrX::~StrX(&local_90);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
      iVar9 = local_34;
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_98 != st_NoActVal) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a6,&local_58,local_90.fLocalForm,"st_NoActVal",pcVar7);
        StrX::~StrX(&local_90);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      pvVar6 = (void *)0x17a6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a6,&local_58);
      StrX::~StrX(&local_90);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_98 != st_NoActVal) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a7,local_78,local_90.fLocalForm,"st_NoActVal",pcVar7);
        StrX::~StrX(&local_90);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      pvVar6 = (void *)0x17a7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a7,local_78);
      StrX::~StrX(&local_90);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (pXVar4 == (XSValue *)0x0) {
      if ((uint)(iVar9 == 1) * 3 + st_NoActVal != local_98) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_NoActVal";
        if (iVar9 == 1) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ab,local_70,local_90.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_90);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      pvVar6 = (void *)0x17ab;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ab,local_70);
      StrX::~StrX(&local_90);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (pXVar4 == (XSValue *)0x0) {
      if ((uint)(iVar9 == 1) * 3 + st_NoActVal != local_98) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_NoActVal";
        if (iVar9 == 1) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ad,local_48,local_90.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_90);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      pvVar6 = (void *)0x17ad;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ad,local_48);
      StrX::~StrX(&local_90);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (pXVar4 == (XSValue *)0x0) {
      if ((uint)(iVar9 == 1) * 3 + st_NoActVal != local_98) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_NoActVal";
        if (iVar9 == 1) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17af,local_80,local_90.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_90);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      pvVar6 = (void *)0x17af;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17af,local_80);
      StrX::~StrX(&local_90);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = 1;
  do {
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (lVar5 == 0) {
      if (local_98 != st_NoCanRep) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17cc,local_60,local_90.fLocalForm,"st_NoCanRep",pcVar7);
        StrX::~StrX(&local_90);
        goto LAB_00137ef7;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17cc,local_60);
      StrX::~StrX(&local_90);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00137ef7:
      errSeen = 1;
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (lVar5 == 0) {
      if (local_98 != st_NoCanRep) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17cd,&local_58,local_90.fLocalForm,"st_NoCanRep",pcVar7);
        StrX::~StrX(&local_90);
        goto LAB_00138008;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17cd,&local_58);
      StrX::~StrX(&local_90);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00138008:
      errSeen = 1;
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (lVar5 == 0) {
      if (local_98 != st_NoCanRep) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ce,local_78,local_90.fLocalForm,"st_NoCanRep",pcVar7);
        StrX::~StrX(&local_90);
        goto LAB_00138119;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ce,local_78);
      StrX::~StrX(&local_90);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00138119:
      errSeen = 1;
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (lVar5 == 0) {
      if ((uint)(iVar9 == 1) * 4 + st_NoCanRep != local_98) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_NoCanRep";
        if (iVar9 == 1) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d2,local_70,local_90.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_90);
        goto LAB_00138248;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d2,local_70);
      StrX::~StrX(&local_90);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00138248:
      errSeen = 1;
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (lVar5 == 0) {
      if ((uint)(iVar9 == 1) * 4 + st_NoCanRep != local_98) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_NoCanRep";
        if (iVar9 == 1) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d4,local_48,local_90.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_90);
        goto LAB_00138377;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d4,local_48);
      StrX::~StrX(&local_90);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00138377:
      errSeen = 1;
    }
    local_98 = st_Init;
    local_90.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_90.fUnicodeForm,local_94,&local_98,ver_10,iVar9 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_90);
    if (lVar5 == 0) {
      if ((uint)(iVar9 == 1) * 4 + st_NoCanRep != local_98) {
        pXVar3 = getDataTypeString(local_94);
        StrX::StrX(&local_90,pXVar3);
        pcVar7 = "st_NoCanRep";
        if (iVar9 == 1) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_98 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_98];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d6,local_80,local_90.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_90);
        goto LAB_001384a6;
      }
    }
    else {
      pXVar3 = getDataTypeString(local_94);
      StrX::StrX(&local_90,pXVar3);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d6,local_80);
      StrX::~StrX(&local_90);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_001384a6:
      errSeen = 1;
    }
    iVar9 = iVar9 + -1;
    if (iVar9 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_NCName_ID_IDREF_ENTITY(XSValue::DataType dt)
{
    bool  toValidate = true;

    const char v_1[]="Four-_.";
    const char v_2[]="_Zeerochert";
    const char v_3[]="L007";

    const char iv_1[]=":Four-_.";
    const char iv_2[]="_Zeerochert:";
    const char iv_3[]="0:07";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}